

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tremove(lua_State *L)

{
  ulong def;
  ulong local_20;
  lua_Integer pos;
  lua_Integer size;
  lua_State *L_local;
  
  checktab(L,1,7);
  def = luaL_len(L,1);
  local_20 = luaL_optinteger(L,2,def);
  if ((local_20 != def) && (def < local_20 - 1)) {
    luaL_argerror(L,2,"position out of bounds");
  }
  lua_geti(L,1,local_20);
  for (; (long)local_20 < (long)def; local_20 = local_20 + 1) {
    lua_geti(L,1,local_20 + 1);
    lua_seti(L,1,local_20);
  }
  lua_pushnil(L);
  lua_seti(L,1,local_20);
  return 1;
}

Assistant:

static int tremove (lua_State *L) {
  lua_Integer size = aux_getn(L, 1, TAB_RW);
  lua_Integer pos = luaL_optinteger(L, 2, size);
  if (pos != size)  /* validate 'pos' if given */
    /* check whether 'pos' is in [1, size + 1] */
    luaL_argcheck(L, (lua_Unsigned)pos - 1u <= (lua_Unsigned)size, 2,
                     "position out of bounds");
  lua_geti(L, 1, pos);  /* result = t[pos] */
  for ( ; pos < size; pos++) {
    lua_geti(L, 1, pos + 1);
    lua_seti(L, 1, pos);  /* t[pos] = t[pos + 1] */
  }
  lua_pushnil(L);
  lua_seti(L, 1, pos);  /* remove entry t[pos] */
  return 1;
}